

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::report_fatal_error(Twine *Reason,bool GenCrashDiag)

{
  fatal_error_handler_t p_Var1;
  lock_guard<std::mutex> lVar2;
  raw_ostream *prVar3;
  StringRef SVar4;
  ssize_t written;
  StringRef MessageStr;
  raw_svector_ostream OS;
  SmallVector<char,_64U> Buffer;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> Lock;
  void *handlerData;
  fatal_error_handler_t handler;
  bool GenCrashDiag_local;
  Twine *Reason_local;
  
  Lock._M_device = (mutex_type *)0x0;
  std::lock_guard<std::mutex>::lock_guard(&local_40,&ErrorHandlerMutex);
  p_Var1 = ErrorHandler_abi_cxx11_;
  Lock._M_device = (mutex_type *)ErrorHandlerUserData;
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  lVar2 = Lock;
  if (p_Var1 == (fatal_error_handler_t)0x0) {
    SmallVector<char,_64U>::SmallVector((SmallVector<char,_64U> *)&OS.OS);
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)&MessageStr.Length,(SmallVectorImpl<char> *)&OS.OS);
    prVar3 = raw_ostream::operator<<((raw_ostream *)&MessageStr.Length,"LLVM ERROR: ");
    prVar3 = operator<<(prVar3,Reason);
    raw_ostream::operator<<(prVar3,"\n");
    SVar4 = raw_svector_ostream::str((raw_svector_ostream *)&MessageStr.Length);
    written = (ssize_t)SVar4.Data;
    MessageStr.Data = (char *)SVar4.Length;
    write(2,(void *)written,(size_t)MessageStr.Data);
    raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)&MessageStr.Length);
    SmallVector<char,_64U>::~SmallVector((SmallVector<char,_64U> *)&OS.OS);
  }
  else {
    Twine::str_abi_cxx11_
              ((string *)(Buffer.super_SmallVectorStorage<char,_64U>.InlineElts + 0x38),Reason);
    (*p_Var1)(lVar2._M_device,
              (string *)(Buffer.super_SmallVectorStorage<char,_64U>.InlineElts + 0x38),GenCrashDiag)
    ;
    std::__cxx11::string::~string
              ((string *)(Buffer.super_SmallVectorStorage<char,_64U>.InlineElts + 0x38));
  }
  sys::RunInterruptHandlers();
  exit(1);
}

Assistant:

void llvm::report_fatal_error(const Twine &Reason, bool GenCrashDiag) {
  llvm::fatal_error_handler_t handler = nullptr;
  void* handlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(ErrorHandlerMutex);
#endif
    handler = ErrorHandler;
    handlerData = ErrorHandlerUserData;
  }

  if (handler) {
    handler(handlerData, Reason.str(), GenCrashDiag);
  } else {
    // Blast the result out to stderr.  We don't try hard to make sure this
    // succeeds (e.g. handling EINTR) and we can't use errs() here because
    // raw ostreams can call report_fatal_error.
    SmallVector<char, 64> Buffer;
    raw_svector_ostream OS(Buffer);
    OS << "LLVM ERROR: " << Reason << "\n";
    StringRef MessageStr = OS.str();
    ssize_t written = ::write(2, MessageStr.data(), MessageStr.size());
    (void)written; // If something went wrong, we deliberately just give up.
  }

  // If we reached here, we are failing ungracefully. Run the interrupt handlers
  // to make sure any special cleanups get done, in particular that we remove
  // files registered with RemoveFileOnSignal.
  sys::RunInterruptHandlers();

  exit(1);
}